

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::MemberSorter::sort(MemberSorter *this)

{
  size_t new_size;
  size_t new_size_00;
  uint *puVar1;
  bool bVar2;
  undefined8 uVar3;
  _Iter_comp_iter<spirv_cross::CompilerMSL::MemberSorter> __comp;
  _Iter_comp_iter<spirv_cross::CompilerMSL::MemberSorter> __comp_00;
  char *pcVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  BuiltIn BVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint *__buffer;
  long lVar20;
  ulong uVar21;
  long lVar22;
  SPIRType *pSVar23;
  uint32_t *puVar24;
  uint32_t *puVar25;
  Decoration *pDVar26;
  ulong uVar27;
  Decoration *pDVar28;
  byte bVar29;
  int iVar31;
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar33 [16];
  int iVar35;
  undefined1 auVar34 [16];
  pair<unsigned_int_*,_long> pVar36;
  Vector<Decoration> mbr_meta_cpy;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> mbr_types_cpy;
  SmallVector<unsigned_int,_8UL> mbr_idxs;
  SmallVector<spirv_cross::Meta::Decoration,_0UL> local_c8;
  undefined1 local_a8 [64];
  SmallVector<unsigned_int,_8UL> local_68;
  
  bVar29 = 0;
  new_size = (this->type->member_types).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
  local_68.super_VectorView<unsigned_int>.ptr = (uint *)&local_68.stack_storage;
  local_68.super_VectorView<unsigned_int>.buffer_size = 0;
  local_68.buffer_capacity = 8;
  SmallVector<unsigned_int,_8UL>::resize(&local_68,new_size);
  puVar1 = local_68.super_VectorView<unsigned_int>.ptr;
  auVar19 = _DAT_0034c1b0;
  auVar18 = _DAT_0034c1a0;
  auVar17 = _DAT_0034c190;
  if (local_68.super_VectorView<unsigned_int>.buffer_size != 0) {
    lVar20 = local_68.super_VectorView<unsigned_int>.buffer_size * 4;
    pcVar4 = (char *)local_68.super_VectorView<unsigned_int>.ptr;
    uVar21 = local_68.super_VectorView<unsigned_int>.buffer_size + 0x3fffffffffffffff &
             0x3fffffffffffffff;
    auVar30._8_4_ = (int)uVar21;
    auVar30._0_8_ = uVar21;
    auVar30._12_4_ = (int)(uVar21 >> 0x20);
    lVar22 = 0;
    auVar30 = auVar30 ^ _DAT_0034c1b0;
    do {
      iVar32 = (int)lVar22;
      auVar33._8_4_ = iVar32;
      auVar33._0_8_ = lVar22;
      auVar33._12_4_ = (int)((ulong)lVar22 >> 0x20);
      auVar34 = (auVar33 | auVar18) ^ auVar19;
      iVar31 = auVar30._4_4_;
      if ((bool)(~(auVar34._4_4_ == iVar31 && auVar30._0_4_ < auVar34._0_4_ ||
                  iVar31 < auVar34._4_4_) & 1)) {
        *(int *)((char *)local_68.super_VectorView<unsigned_int>.ptr + lVar22 * 4) = iVar32;
      }
      if ((auVar34._12_4_ != auVar30._12_4_ || auVar34._8_4_ <= auVar30._8_4_) &&
          auVar34._12_4_ <= auVar30._12_4_) {
        *(int *)((char *)local_68.super_VectorView<unsigned_int>.ptr + lVar22 * 4 + 4) = iVar32 + 1;
      }
      auVar33 = (auVar33 | auVar17) ^ auVar19;
      iVar35 = auVar33._4_4_;
      if (iVar35 <= iVar31 && (iVar35 != iVar31 || auVar33._0_4_ <= auVar30._0_4_)) {
        *(int *)((char *)local_68.super_VectorView<unsigned_int>.ptr + lVar22 * 4 + 8) = iVar32 + 2;
        *(int *)((char *)local_68.super_VectorView<unsigned_int>.ptr + lVar22 * 4 + 0xc) =
             iVar32 + 3;
      }
      lVar22 = lVar22 + 4;
    } while ((uVar21 - ((uint)(local_68.super_VectorView<unsigned_int>.buffer_size +
                              0x3fffffffffffffff) & 3)) + 4 != lVar22);
    local_c8.buffer_capacity = *(size_t *)&this->sort_aspect;
    local_c8.super_VectorView<spirv_cross::Meta::Decoration>.ptr = (Decoration *)this->type;
    local_c8.super_VectorView<spirv_cross::Meta::Decoration>.buffer_size = (size_t)this->meta;
    local_a8._16_8_ = *(undefined8 *)&this->sort_aspect;
    local_a8._0_8_ = this->type;
    local_a8._8_8_ = this->meta;
    pVar36 = ::std::get_temporary_buffer<unsigned_int>
                       ((long)((local_68.super_VectorView<unsigned_int>.buffer_size -
                               ((long)(local_68.super_VectorView<unsigned_int>.buffer_size + 1) >>
                               0x3f)) + 1) >> 1);
    __buffer = pVar36.first;
    if (__buffer == (uint *)0x0) {
      __comp_00._M_comp.meta =
           (Meta *)local_c8.super_VectorView<spirv_cross::Meta::Decoration>.buffer_size;
      __comp_00._M_comp.type =
           (SPIRType *)local_c8.super_VectorView<spirv_cross::Meta::Decoration>.ptr;
      __comp_00._M_comp._16_8_ = local_c8.buffer_capacity;
      ::std::
      __inplace_stable_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::MemberSorter>>
                (puVar1,(uint *)(pcVar4 + lVar20),__comp_00);
    }
    else {
      __comp._M_comp.meta = (Meta *)local_a8._8_8_;
      __comp._M_comp.type = (SPIRType *)local_a8._0_8_;
      __comp._M_comp._16_8_ = local_a8._16_8_;
      ::std::
      __stable_sort_adaptive<unsigned_int*,unsigned_int*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::MemberSorter>>
                (puVar1,(uint *)(pcVar4 + lVar20),__buffer,pVar36.second,__comp);
    }
    operator_delete(__buffer);
  }
  if (new_size != 0) {
    uVar21 = 0;
    do {
      if ((int)uVar21 != *(int *)((char *)local_68.super_VectorView<unsigned_int>.ptr + uVar21 * 4))
      {
        pSVar23 = this->type;
        new_size_00 = (pSVar23->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
        if ((this->meta->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size <
            new_size_00) {
          SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize(&this->meta->members,new_size_00);
          pSVar23 = this->type;
        }
        local_a8._0_8_ = local_a8 + 0x18;
        local_a8._8_8_ = 0;
        local_a8._16_8_ = 8;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)local_a8,
                   &pSVar23->member_types);
        local_c8.buffer_capacity = 0;
        local_c8.super_VectorView<spirv_cross::Meta::Decoration>.ptr = (Decoration *)0x0;
        local_c8.super_VectorView<spirv_cross::Meta::Decoration>.buffer_size = 0;
        SmallVector<spirv_cross::Meta::Decoration,_0UL>::operator=(&local_c8,&this->meta->members);
        uVar21 = 0;
        uVar27 = 1;
        do {
          (this->type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
          ptr[uVar21].id =
               *(uint32_t *)
                ((((SmallVector<unsigned_int,_8UL> *)(local_a8._0_8_ + 0x20))->stack_storage).
                 aligned_char +
                (ulong)*(uint *)((char *)local_68.super_VectorView<unsigned_int>.ptr + uVar21 * 4) *
                4 + -0x38);
          pDVar28 = local_c8.super_VectorView<spirv_cross::Meta::Decoration>.ptr +
                    *(uint *)((char *)local_68.super_VectorView<unsigned_int>.ptr + uVar21 * 4);
          pDVar26 = (this->meta->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr +
                    uVar21;
          ::std::__cxx11::string::_M_assign((string *)pDVar26);
          ::std::__cxx11::string::_M_assign((string *)&pDVar26->qualified_alias);
          ::std::__cxx11::string::_M_assign((string *)&pDVar26->hlsl_semantic);
          (pDVar26->decoration_flags).lower = (pDVar28->decoration_flags).lower;
          if (pDVar28 == pDVar26) {
            BVar13 = pDVar28->builtin_type;
            uVar14 = pDVar28->location;
            uVar15 = pDVar28->component;
            uVar16 = pDVar28->set;
            uVar9 = pDVar28->binding;
            uVar10 = pDVar28->offset;
            uVar11 = pDVar28->xfb_buffer;
            uVar12 = pDVar28->xfb_stride;
            uVar5 = pDVar28->stream;
            uVar6 = pDVar28->array_stride;
            uVar7 = pDVar28->matrix_stride;
            uVar8 = pDVar28->input_attachment;
            uVar3 = *(undefined8 *)((long)&pDVar28->index + 1);
            *(undefined8 *)((long)&pDVar26->input_attachment + 1) =
                 *(undefined8 *)((long)&pDVar28->input_attachment + 1);
            *(undefined8 *)((long)&pDVar26->index + 1) = uVar3;
            pDVar26->stream = uVar5;
            pDVar26->array_stride = uVar6;
            pDVar26->matrix_stride = uVar7;
            pDVar26->input_attachment = uVar8;
            pDVar26->binding = uVar9;
            pDVar26->offset = uVar10;
            pDVar26->xfb_buffer = uVar11;
            pDVar26->xfb_stride = uVar12;
            pDVar26->builtin_type = BVar13;
            pDVar26->location = uVar14;
            pDVar26->component = uVar15;
            pDVar26->set = uVar16;
            (pDVar26->extended).flags.lower = (pDVar28->extended).flags.lower;
          }
          else {
            ::std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&(pDVar26->decoration_flags).higher,
                       &(pDVar28->decoration_flags).higher._M_h);
            BVar13 = pDVar28->builtin_type;
            uVar14 = pDVar28->location;
            uVar15 = pDVar28->component;
            uVar16 = pDVar28->set;
            uVar9 = pDVar28->binding;
            uVar10 = pDVar28->offset;
            uVar11 = pDVar28->xfb_buffer;
            uVar12 = pDVar28->xfb_stride;
            uVar5 = pDVar28->stream;
            uVar6 = pDVar28->array_stride;
            uVar7 = pDVar28->matrix_stride;
            uVar8 = pDVar28->input_attachment;
            uVar3 = *(undefined8 *)((long)&pDVar28->index + 1);
            *(undefined8 *)((long)&pDVar26->input_attachment + 1) =
                 *(undefined8 *)((long)&pDVar28->input_attachment + 1);
            *(undefined8 *)((long)&pDVar26->index + 1) = uVar3;
            pDVar26->stream = uVar5;
            pDVar26->array_stride = uVar6;
            pDVar26->matrix_stride = uVar7;
            pDVar26->input_attachment = uVar8;
            pDVar26->binding = uVar9;
            pDVar26->offset = uVar10;
            pDVar26->xfb_buffer = uVar11;
            pDVar26->xfb_stride = uVar12;
            pDVar26->builtin_type = BVar13;
            pDVar26->location = uVar14;
            pDVar26->component = uVar15;
            pDVar26->set = uVar16;
            (pDVar26->extended).flags.lower = (pDVar28->extended).flags.lower;
            ::std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&(pDVar26->extended).flags.higher,&(pDVar28->extended).flags.higher._M_h);
          }
          puVar24 = (pDVar28->extended).values;
          puVar25 = (pDVar26->extended).values;
          for (lVar20 = 8; lVar20 != 0; lVar20 = lVar20 + -1) {
            *(undefined8 *)puVar25 = *(undefined8 *)puVar24;
            puVar24 = puVar24 + (ulong)bVar29 * -4 + 2;
            puVar25 = puVar25 + (ulong)bVar29 * -4 + 2;
          }
          (pDVar26->extended).values[0x10] = (pDVar28->extended).values[0x10];
          bVar2 = uVar27 < new_size;
          uVar21 = uVar27;
          uVar27 = (ulong)((int)uVar27 + 1);
        } while (bVar2);
        if (this->sort_aspect == Offset) {
          SmallVector<unsigned_int,_8UL>::resize
                    (&this->type->member_type_index_redirection,new_size);
          puVar1 = (this->type->member_type_index_redirection).super_VectorView<unsigned_int>.ptr;
          uVar21 = 0;
          do {
            puVar1[*(uint *)((char *)local_68.super_VectorView<unsigned_int>.ptr + uVar21 * 4)] =
                 (uint)uVar21;
            uVar21 = uVar21 + 1;
          } while ((uVar21 & 0xffffffff) < new_size);
        }
        SmallVector<spirv_cross::Meta::Decoration,_0UL>::~SmallVector(&local_c8);
        local_a8._8_8_ = (Meta *)0x0;
        if ((SPIRType *)local_a8._0_8_ != (SPIRType *)(local_a8 + 0x18)) {
          free((void *)local_a8._0_8_);
        }
        break;
      }
      uVar21 = (ulong)((int)uVar21 + 1);
    } while (uVar21 < new_size);
  }
  local_68.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_68.super_VectorView<unsigned_int>.ptr !=
      &local_68.stack_storage) {
    free(local_68.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerMSL::MemberSorter::sort()
{
	// Create a temporary array of consecutive member indices and sort it based on how
	// the members should be reordered, based on builtin and sorting aspect meta info.
	size_t mbr_cnt = type.member_types.size();
	SmallVector<uint32_t> mbr_idxs(mbr_cnt);
	std::iota(mbr_idxs.begin(), mbr_idxs.end(), 0); // Fill with consecutive indices
	std::stable_sort(mbr_idxs.begin(), mbr_idxs.end(), *this); // Sort member indices based on sorting aspect

	bool sort_is_identity = true;
	for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
	{
		if (mbr_idx != mbr_idxs[mbr_idx])
		{
			sort_is_identity = false;
			break;
		}
	}

	if (sort_is_identity)
		return;

	if (meta.members.size() < type.member_types.size())
	{
		// This should never trigger in normal circumstances, but to be safe.
		meta.members.resize(type.member_types.size());
	}

	// Move type and meta member info to the order defined by the sorted member indices.
	// This is done by creating temporary copies of both member types and meta, and then
	// copying back to the original content at the sorted indices.
	auto mbr_types_cpy = type.member_types;
	auto mbr_meta_cpy = meta.members;
	for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
	{
		type.member_types[mbr_idx] = mbr_types_cpy[mbr_idxs[mbr_idx]];
		meta.members[mbr_idx] = mbr_meta_cpy[mbr_idxs[mbr_idx]];
	}

	// If we're sorting by Offset, this might affect user code which accesses a buffer block.
	// We will need to redirect member indices from defined index to sorted index using reverse lookup.
	if (sort_aspect == SortAspect::Offset)
	{
		type.member_type_index_redirection.resize(mbr_cnt);
		for (uint32_t map_idx = 0; map_idx < mbr_cnt; map_idx++)
			type.member_type_index_redirection[mbr_idxs[map_idx]] = map_idx;
	}
}